

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

void __thiscall
TPZSparseBlockDiagonal<float>::Print
          (TPZSparseBlockDiagonal<float> *this,char *message,ostream *out,MatrixOutputFormat format)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  TPZBlockDiagonal<float>::Print(&this->super_TPZBlockDiagonal<float>,message,out,format);
  if (format == EFormatted) {
    poVar3 = std::operator<<(out,"Equations for each block ");
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar5 = (this->fBlockIndex).fNElements;
    lVar4 = 1;
    if (1 < lVar5) {
      lVar4 = lVar5;
    }
    lVar5 = 0;
    while (lVar5 != lVar4 + -1) {
      plVar1 = (this->fBlockIndex).fStore;
      lVar6 = plVar1[lVar5];
      lVar2 = plVar1[lVar5 + 1];
      lVar5 = lVar5 + 1;
      poVar3 = std::operator<<(out,"Block ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::operator<<(poVar3," : ");
      for (; lVar6 < lVar2; lVar6 = lVar6 + 1) {
        poVar3 = std::ostream::_M_insert<long>((long)out);
        std::operator<<(poVar3," ");
      }
      std::endl<char,std::char_traits<char>>(out);
    }
  }
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::Print(const char* message, std::ostream& out, const MatrixOutputFormat format) const
{
	TPZBlockDiagonal<TVar>::Print(message, out, format);
	if(format == EFormatted)
	{
		out << "Equations for each block " << endl;
		int64_t nbl = fBlockIndex.NElements()-1;
		int64_t ibl;
		for(ibl = 0; ibl<nbl ; ibl++)
		{
			int64_t first = fBlockIndex[ibl];
			int64_t last = fBlockIndex[ibl+1];
			out << "Block " << ibl << " : ";
			int64_t i;
			for(i=first; i<last; i++) out << fBlock[i] << " ";
			out << endl;
		}
	}
}